

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O0

void __thiscall
neural_networks::NeuralNetwork::NeuralNetwork
          (NeuralNetwork *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *dimensions,
          string *new_label,longdouble rate)

{
  size_t sVar1;
  size_t previous_layer_size;
  ulong uVar2;
  size_type sVar3;
  NeuralLayer *pNVar4;
  const_reference pvVar5;
  reference ppNVar6;
  string local_a8 [32];
  ulong local_88;
  size_t i;
  string local_78 [55];
  allocator<neural_networks::utilities::NeuralLayer_*> local_41;
  value_type local_40;
  undefined1 auStack_38 [8];
  longdouble rate_local;
  string *local_20;
  string *new_label_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *dimensions_local;
  NeuralNetwork *this_local;
  
  _auStack_38 = rate;
  this->_vptr_NeuralNetwork = (_func_int **)&PTR_set_data_00119d30;
  local_20 = new_label;
  new_label_local = (string *)dimensions;
  dimensions_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this;
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(dimensions);
  local_40 = (value_type)0x0;
  std::allocator<neural_networks::utilities::NeuralLayer_*>::allocator(&local_41);
  std::
  vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
  ::vector(&this->layers,sVar3,&local_40,&local_41);
  std::allocator<neural_networks::utilities::NeuralLayer_*>::~allocator(&local_41);
  this->learning_rate = _auStack_38;
  std::__cxx11::string::string((string *)&this->label,(string *)new_label);
  pNVar4 = (NeuralLayer *)operator_new(0x50);
  i._7_1_ = 1;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)new_label_local,0);
  sVar1 = *pvVar5;
  std::__cxx11::string::string(local_78);
  utilities::NeuralLayer::NeuralLayer(pNVar4,sVar1,0,(string *)local_78);
  i._7_1_ = 0;
  ppNVar6 = std::
            vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
            ::operator[](&this->layers,0);
  *ppNVar6 = pNVar4;
  std::__cxx11::string::~string(local_78);
  local_88 = 1;
  while( true ) {
    uVar2 = local_88;
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)new_label_local);
    if (sVar3 <= uVar2) break;
    pNVar4 = (NeuralLayer *)operator_new(0x50);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)new_label_local,
                        local_88);
    sVar1 = *pvVar5;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)new_label_local,
                        local_88 - 1);
    previous_layer_size = *pvVar5;
    std::__cxx11::string::string(local_a8);
    utilities::NeuralLayer::NeuralLayer(pNVar4,sVar1,previous_layer_size,(string *)local_a8);
    ppNVar6 = std::
              vector<neural_networks::utilities::NeuralLayer_*,_std::allocator<neural_networks::utilities::NeuralLayer_*>_>
              ::operator[](&this->layers,local_88);
    *ppNVar6 = pNVar4;
    std::__cxx11::string::~string(local_a8);
    local_88 = local_88 + 1;
  }
  return;
}

Assistant:

NeuralNetwork::NeuralNetwork(const std::vector<size_t>& dimensions, std::string new_label, long double rate) :
        layers(dimensions.size(), nullptr), label(new_label), learning_rate(rate) {
    layers[0] = new utilities::NeuralLayer(dimensions[0], 0);
    for(register size_t i = 1; i < dimensions.size(); ++i) {
        layers[i] = new utilities::NeuralLayer(dimensions[i], dimensions[i - 1]);
    }
}